

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

iterator __thiscall Json::Value::begin(Value *this)

{
  long lVar1;
  LargestInt LVar2;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  bool bVar3;
  iterator iVar4;
  
  bVar3 = (*(ushort *)(CONCAT71(in_register_00000031,in_SIL) + 8) & 0xfe) == 6;
  lVar1 = *(long *)CONCAT71(in_register_00000031,in_SIL);
  if (lVar1 != 0 && bVar3) {
    LVar2 = *(LargestInt *)(lVar1 + 0x18);
  }
  else {
    LVar2 = 0;
  }
  (this->value_).int_ = LVar2;
  *(bool *)&this->bits_ = lVar1 == 0 || !bVar3;
  iVar4.super_ValueIteratorBase._8_8_ = LVar2;
  iVar4.super_ValueIteratorBase.current_._M_node = (_Base_ptr)this;
  return (iterator)iVar4.super_ValueIteratorBase;
}

Assistant:

Value::iterator Value::begin() {
  switch (type()) {
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return iterator(value_.map_->begin());
    break;
  default:
    break;
  }
  return iterator();
}